

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v4::load_s_motions(xr_ogf_v4 *this,xr_reader *r)

{
  byte *pbVar1;
  uint *puVar2;
  size_t sVar3;
  char *__s;
  xr_skl_motion *this_00;
  undefined8 uVar4;
  uint32_t find_id;
  allocator<char> local_61;
  xr_bone_vec *local_60;
  ulong local_58;
  string local_50;
  
  sVar3 = xr_reader::find_chunk(r,0);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x15e,"void xray_re::xr_ogf_v4::load_s_motions(xr_reader &)");
  }
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  local_58 = (ulong)*puVar2;
  if ((long)(this->super_xr_ogf).super_xr_object.m_motions.
            super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->super_xr_ogf).super_xr_object.m_motions.
            super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 == local_58) {
    local_60 = &(this->super_xr_ogf).super_xr_object.m_bones;
    find_id = 1;
    while( true ) {
      if ((uint)local_58 < find_id) {
        pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 1);
        *pbVar1 = *pbVar1 | 0x40;
        return;
      }
      sVar3 = xr_reader::find_chunk(r,find_id);
      if (sVar3 == 0) break;
      __s = xr_reader::skip_sz(r);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_61);
      this_00 = xr_object::find_motion((xr_object *)this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (this_00 == (xr_skl_motion *)0x0) {
        msg("unknown motion %s",__s);
        uVar4 = __cxa_allocate_exception(1);
        __cxa_throw(uVar4,&xr_error::typeinfo,0);
      }
      motion_io::import_bone_motions((motion_io *)this_00,r,local_60);
      find_id = find_id + 1;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x163,"void xray_re::xr_ogf_v4::load_s_motions(xr_reader &)");
  }
  __assert_fail("m_motions.size() == num_motions",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                ,0x160,"void xray_re::xr_ogf_v4::load_s_motions(xr_reader &)");
}

Assistant:

void xr_ogf_v4::load_s_motions(xr_reader& r)
{
	if (!r.find_chunk(0))
		xr_not_expected();
	size_t num_motions = r.r_u32();
	xr_assert(m_motions.size() == num_motions);
	for (uint32_t id = 1; id <= num_motions; ++id) {
		if (!r.find_chunk(id))
			xr_not_expected();

		const char* name = r.skip_sz();
		motion_io* smotion = static_cast<motion_io*>(find_motion(name));
		if (smotion == 0) {
			msg("unknown motion %s", name);
			throw xr_error();
		}
		smotion->import_bone_motions(r, m_bones);
		r.debug_find_chunk();
	}
	set_chunk_loaded(OGF4_S_MOTIONS);
}